

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O1

_Bool ptrlen_endswith(ptrlen whole,ptrlen suffix,ptrlen *tail)

{
  int iVar1;
  ulong __n;
  size_t sVar2;
  
  __n = suffix.len;
  sVar2 = whole.len - __n;
  if ((__n <= whole.len) &&
     (iVar1 = bcmp((void *)((long)whole.ptr + sVar2),suffix.ptr,__n), iVar1 == 0)) {
    if (tail == (ptrlen *)0x0) {
      return true;
    }
    tail->ptr = whole.ptr;
    tail->len = sVar2;
    return true;
  }
  return false;
}

Assistant:

bool ptrlen_endswith(ptrlen whole, ptrlen suffix, ptrlen *tail)
{
    if (whole.len >= suffix.len &&
        !memcmp((char *)whole.ptr + (whole.len - suffix.len),
                suffix.ptr, suffix.len)) {
        if (tail) {
            tail->ptr = whole.ptr;
            tail->len = whole.len - suffix.len;
        }
        return true;
    }
    return false;
}